

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_14::BinaryReaderObjdumpDisassemble::OnLocalDecl
          (BinaryReaderObjdumpDisassemble *this,Index decl_index,Index count,Type type)

{
  char *pcVar1;
  long lVar2;
  ulong uVar3;
  Offset OVar4;
  ulong uVar5;
  Offset OVar6;
  Offset OVar7;
  Type local_44;
  Offset local_40;
  ulong local_38;
  
  OVar4 = this->current_opcode_offset;
  OVar7 = ((this->super_BinaryReaderObjdumpBase).super_BinaryReaderNop.super_BinaryReaderDelegate.
          state)->offset;
  local_44.enum_ = type.enum_;
  printf(" %06zx:",OVar4);
  uVar3 = OVar7 - OVar4;
  if (uVar3 != 0) {
    uVar5 = 9;
    OVar6 = OVar4;
    local_40 = OVar7;
    local_38 = (ulong)count;
    if (uVar3 < 9) {
      uVar5 = uVar3;
    }
    do {
      printf(" %02x",(ulong)(this->super_BinaryReaderObjdumpBase).data_[OVar6]);
      uVar5 = uVar5 - 1;
      OVar6 = OVar6 + 1;
    } while (uVar5 != 0);
    count = (Index)local_38;
    OVar7 = local_40;
    if (8 < uVar3) goto LAB_001264e2;
  }
  lVar2 = (OVar4 - OVar7) + 9;
  do {
    printf("   ");
    lVar2 = lVar2 + -1;
  } while (lVar2 != 0);
LAB_001264e2:
  printf(" | local[%u",(ulong)this->local_index_);
  if (count != 1) {
    printf("..%u",(ulong)((count + this->local_index_) - 1));
  }
  this->local_index_ = this->local_index_ + count;
  pcVar1 = Type::GetName(&local_44);
  printf("] type=%s\n",pcVar1);
  OVar4 = uVar3 + this->current_opcode_offset;
  this->last_opcode_end = OVar4;
  this->current_opcode_offset = OVar4;
  return (Result)Ok;
}

Assistant:

Result BinaryReaderObjdumpDisassemble::OnLocalDecl(Index decl_index,
                                                   Index count,
                                                   Type type) {
  Offset offset = current_opcode_offset;
  size_t data_size = state->offset - offset;

  printf(" %06" PRIzx ":", offset);
  for (size_t i = 0; i < data_size && i < IMMEDIATE_OCTET_COUNT;
       i++, offset++) {
    printf(" %02x", data_[offset]);
  }
  for (size_t i = data_size; i < IMMEDIATE_OCTET_COUNT; i++) {
    printf("   ");
  }
  printf(" | local[%" PRIindex, local_index_);

  if (count != 1) {
    printf("..%" PRIindex "", local_index_ + count - 1);
  }
  local_index_ += count;

  printf("] type=%s\n", type.GetName());

  last_opcode_end = current_opcode_offset + data_size;
  current_opcode_offset = last_opcode_end;

  return Result::Ok;
}